

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceMethod
          (Parser *this,MethodDescriptorProto *method,LocationRecorder *method_location,
          FileDescriptorProto *containing_file)

{
  Location *containing_file_00;
  bool bVar1;
  string *psVar2;
  MethodOptions *mutable_options;
  undefined1 local_b8 [8];
  LocationRecorder location_3;
  LocationRecorder location_4;
  LocationRecorder location_1;
  LocationRecorder location_2;
  undefined1 local_48 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *method_location_local;
  MethodDescriptorProto *method_local;
  Parser *this_local;
  
  location.location_ = (Location *)containing_file;
  bVar1 = Consume(this,"rpc");
  if (bVar1) {
    LocationRecorder::LocationRecorder((LocationRecorder *)local_48,method_location,1);
    LocationRecorder::RecordLegacyLocation((LocationRecorder *)local_48,&method->super_Message,NAME)
    ;
    psVar2 = MethodDescriptorProto::mutable_name_abi_cxx11_(method);
    bVar1 = ConsumeIdentifier(this,psVar2,"Expected method name.");
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_48);
    if (bVar1) {
      bVar1 = Consume(this,"(");
      if (bVar1) {
        bVar1 = LookingAt(this,"stream");
        if (bVar1) {
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)&location_1.location_,method_location,5);
          LocationRecorder::RecordLegacyLocation
                    ((LocationRecorder *)&location_1.location_,&method->super_Message,OTHER);
          MethodDescriptorProto::set_client_streaming(method,true);
          bVar1 = Consume(this,"stream");
          if (!bVar1) {
            this_local._7_1_ = 0;
          }
          LocationRecorder::~LocationRecorder((LocationRecorder *)&location_1.location_);
          if (!bVar1) goto LAB_0063a53a;
        }
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)&location_4.location_,method_location,2);
        LocationRecorder::RecordLegacyLocation
                  ((LocationRecorder *)&location_4.location_,&method->super_Message,INPUT_TYPE);
        psVar2 = MethodDescriptorProto::mutable_input_type_abi_cxx11_(method);
        bVar1 = ParseUserDefinedType(this,psVar2);
        if (!bVar1) {
          this_local._7_1_ = 0;
        }
        LocationRecorder::~LocationRecorder((LocationRecorder *)&location_4.location_);
        if (bVar1) {
          bVar1 = Consume(this,")");
          if (bVar1) {
            bVar1 = Consume(this,"returns");
            if (bVar1) {
              bVar1 = Consume(this,"(");
              if (bVar1) {
                bVar1 = LookingAt(this,"stream");
                if (bVar1) {
                  LocationRecorder::LocationRecorder
                            ((LocationRecorder *)&location_3.location_,method_location,6);
                  LocationRecorder::RecordLegacyLocation
                            ((LocationRecorder *)&location_3.location_,&method->super_Message,OTHER)
                  ;
                  bVar1 = Consume(this,"stream");
                  if (bVar1) {
                    MethodDescriptorProto::set_server_streaming(method,true);
                  }
                  else {
                    this_local._7_1_ = 0;
                  }
                  LocationRecorder::~LocationRecorder((LocationRecorder *)&location_3.location_);
                  if (!bVar1) goto LAB_0063a53a;
                }
                LocationRecorder::LocationRecorder((LocationRecorder *)local_b8,method_location,3);
                LocationRecorder::RecordLegacyLocation
                          ((LocationRecorder *)local_b8,&method->super_Message,OUTPUT_TYPE);
                psVar2 = MethodDescriptorProto::mutable_output_type_abi_cxx11_(method);
                bVar1 = ParseUserDefinedType(this,psVar2);
                if (!bVar1) {
                  this_local._7_1_ = 0;
                }
                LocationRecorder::~LocationRecorder((LocationRecorder *)local_b8);
                if (bVar1) {
                  bVar1 = Consume(this,")");
                  if (bVar1) {
                    bVar1 = LookingAt(this,"{");
                    containing_file_00 = location.location_;
                    if (bVar1) {
                      mutable_options = MethodDescriptorProto::mutable_options(method);
                      bVar1 = ParseMethodOptions(this,method_location,
                                                 (FileDescriptorProto *)containing_file_00,4,
                                                 &mutable_options->super_Message);
                      if (!bVar1) {
                        this_local._7_1_ = 0;
                        goto LAB_0063a53a;
                      }
                    }
                    else {
                      bVar1 = ConsumeEndOfDeclaration(this,";",method_location);
                      if (!bVar1) {
                        this_local._7_1_ = 0;
                        goto LAB_0063a53a;
                      }
                    }
                    this_local._7_1_ = 1;
                  }
                  else {
                    this_local._7_1_ = 0;
                  }
                }
              }
              else {
                this_local._7_1_ = 0;
              }
            }
            else {
              this_local._7_1_ = 0;
            }
          }
          else {
            this_local._7_1_ = 0;
          }
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0063a53a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseServiceMethod(MethodDescriptorProto* method,
                                const LocationRecorder& method_location,
                                const FileDescriptorProto* containing_file) {
  DO(Consume("rpc"));

  {
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(method, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(method->mutable_name(), "Expected method name."));
  }

  // Parse input type.
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kClientStreamingFieldNumber);
      location.RecordLegacyLocation(method,
                                    DescriptorPool::ErrorCollector::OTHER);
      method->set_client_streaming(true);
      DO(Consume("stream"));

    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kInputTypeFieldNumber);
    location.RecordLegacyLocation(method,
                                  DescriptorPool::ErrorCollector::INPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_input_type()));
  }
  DO(Consume(")"));

  // Parse output type.
  DO(Consume("returns"));
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kServerStreamingFieldNumber);
      location.RecordLegacyLocation(method,
                                    DescriptorPool::ErrorCollector::OTHER);
      DO(Consume("stream"));
      method->set_server_streaming(true);

    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kOutputTypeFieldNumber);
    location.RecordLegacyLocation(method,
                                  DescriptorPool::ErrorCollector::OUTPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_output_type()));
  }
  DO(Consume(")"));

  if (LookingAt("{")) {
    // Options!
    DO(ParseMethodOptions(method_location, containing_file,
                          MethodDescriptorProto::kOptionsFieldNumber,
                          method->mutable_options()));
  } else {
    DO(ConsumeEndOfDeclaration(";", &method_location));
  }

  return true;
}